

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.hpp
# Opt level: O0

int linenoise::unicodeReadUTF8Char(int fd,char *buf,int *cp)

{
  byte bVar1;
  int iVar2;
  ssize_t sVar3;
  uchar byte;
  int nread;
  int *cp_local;
  char *buf_local;
  int fd_local;
  
  sVar3 = read(fd,buf,1);
  buf_local._4_4_ = (int)sVar3;
  if (0 < buf_local._4_4_) {
    bVar1 = *buf;
    if ((bVar1 & 0x80) != 0) {
      if ((bVar1 & 0xe0) == 0xc0) {
        sVar3 = read(fd,buf + 1,1);
        iVar2 = (int)sVar3;
      }
      else if ((bVar1 & 0xf0) == 0xe0) {
        sVar3 = read(fd,buf + 1,2);
        iVar2 = (int)sVar3;
      }
      else {
        if ((bVar1 & 0xf8) != 0xf0) {
          return -1;
        }
        sVar3 = read(fd,buf + 1,3);
        iVar2 = (int)sVar3;
      }
      if (iVar2 < 1) {
        return iVar2;
      }
    }
    buf_local._4_4_ = unicodeUTF8CharToCodePoint(buf,4,cp);
  }
  return buf_local._4_4_;
}

Assistant:

inline int unicodeReadUTF8Char(int fd, char* buf, int* cp)
{
    int nread = read(fd,&buf[0],1);

    if (nread <= 0) { return nread; }

    unsigned char byte = buf[0];

    if ((byte & 0x80) == 0) {
        ;
    } else if ((byte & 0xE0) == 0xC0) {
        nread = read(fd,&buf[1],1);
        if (nread <= 0) { return nread; }
    } else if ((byte & 0xF0) == 0xE0) {
        nread = read(fd,&buf[1],2);
        if (nread <= 0) { return nread; }
    } else if ((byte & 0xF8) == 0xF0) {
        nread = read(fd,&buf[1],3);
        if (nread <= 0) { return nread; }
    } else {
        return -1;
    }

    return unicodeUTF8CharToCodePoint(buf, 4, cp);
}